

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

_Bool container_contains(container_t *c,uint16_t val,uint8_t typecode)

{
  _Bool _Var1;
  array_container_t *arr;
  uint8_t in_DL;
  uint16_t in_SI;
  container_t *in_RDI;
  uint8_t local_13;
  uint16_t local_12;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  local_13 = in_DL;
  local_12 = in_SI;
  arr = (array_container_t *)container_unwrap_shared(in_RDI,&local_13);
  if (local_13 == '\x01') {
    _Var1 = bitset_container_get((bitset_container_t *)arr,local_12);
  }
  else if (local_13 == '\x02') {
    _Var1 = array_container_contains(arr,local_12);
  }
  else {
    _Var1 = run_container_contains
                      ((run_container_t *)
                       CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                       (uint16_t)((ulong)arr >> 0x30));
  }
  return _Var1;
}

Assistant:

static inline bool container_contains(
    const container_t *c, uint16_t val,
    uint8_t typecode  // !!! should be second argument?
) {
    c = container_unwrap_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_get(const_CAST_bitset(c), val);
        case ARRAY_CONTAINER_TYPE:
            return array_container_contains(const_CAST_array(c), val);
        case RUN_CONTAINER_TYPE:
            return run_container_contains(const_CAST_run(c), val);
        default:
            assert(false);
            roaring_unreachable;
            return false;
    }
}